

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::AutoFill
          (TPZBlockDiagonal<std::complex<double>_> *this,int64_t neq,int64_t jeq,int symmetric)

{
  double dVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  int *piVar6;
  complex<double> *pcVar7;
  complex<double> *pcVar8;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar9;
  complex<double> val;
  type_conflict1 sum;
  int64_t c;
  int64_t r;
  int64_t nb;
  int64_t pos;
  int64_t eq;
  int64_t bsize;
  int64_t b;
  int64_t blsize;
  int64_t totalsize;
  TPZStack<int,_10> blsizes;
  size_t in_stack_00000278;
  char *in_stack_00000280;
  int in_stack_fffffffffffffe5c;
  TPZStack<int,_10> *in_stack_fffffffffffffe60;
  TPZStack<int,_10> *in_stack_fffffffffffffe70;
  TPZVec<int> *in_stack_fffffffffffffec8;
  TPZBlockDiagonal<std::complex<double>_> *in_stack_fffffffffffffed0;
  complex<double> local_118;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int64_t local_90;
  TPZBlockDiagonal<std::complex<double>_> *local_78;
  long local_70;
  int local_1c;
  long local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  if (in_RSI != in_RDX) {
    pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
  }
  TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffe70);
  for (local_70 = 0; lVar3 = local_10, local_70 < local_10;
      local_70 = (long)&(local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                        super_TPZSavable._vptr_TPZSavable + local_70) {
    iVar4 = rand();
    in_stack_fffffffffffffed0 =
         (TPZBlockDiagonal<std::complex<double>_> *)((lVar3 * iVar4) / 0x7fffffff);
    if (local_10 - local_70 <= (long)in_stack_fffffffffffffed0) {
      in_stack_fffffffffffffed0 = (TPZBlockDiagonal<std::complex<double>_> *)(local_10 - local_70);
    }
    local_78 = in_stack_fffffffffffffed0;
    TPZStack<int,_10>::Push(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  }
  Initialize(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_a0 = 0;
  local_b0 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
  for (local_90 = 0; local_90 < local_b0; local_90 = local_90 + 1) {
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_90);
    local_a8 = *plVar5;
    piVar6 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_90);
    local_98 = (long)*piVar6;
    for (local_c0 = 0; local_c0 < local_98; local_c0 = local_c0 + 1) {
      local_c8 = 0.0;
      local_b8 = 0;
      if (local_1c == 1) {
        for (local_b8 = 0; local_b8 < local_c0; local_b8 = local_b8 + 1) {
          pcVar7 = TPZVec<std::complex<double>_>::operator[]
                             ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                              local_a8 + local_b8 + local_c0 * local_98);
          pcVar8 = TPZVec<std::complex<double>_>::operator[]
                             ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                              local_a8 + local_c0 + local_b8 * local_98);
          uVar2 = *(undefined8 *)(pcVar7->_M_value + 8);
          *(undefined8 *)pcVar8->_M_value = *(undefined8 *)pcVar7->_M_value;
          *(undefined8 *)(pcVar8->_M_value + 8) = uVar2;
          pcVar7 = TPZVec<std::complex<double>_>::operator[]
                             ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                              local_a8 + local_b8 + local_c0 * local_98);
          local_d8 = *(double *)pcVar7->_M_value;
          in_XMM1_Qa = *(double *)(pcVar7->_M_value + 8);
          dStack_d0 = in_XMM1_Qa;
          dVar9 = fabs(local_d8);
          local_c8 = dVar9 + local_c8;
        }
      }
      for (; local_b8 < local_98; local_b8 = local_b8 + 1) {
        TPZMatrix<std::complex<double>_>::GetRandomVal
                  (&in_stack_fffffffffffffed0->super_TPZMatrix<std::complex<double>_>);
        dVar9 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_e8 = dVar9;
        dStack_e0 = in_XMM1_Qa;
        pcVar7 = TPZVec<std::complex<double>_>::operator[]
                           ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                            local_a8 + local_c0 + local_b8 * local_98);
        *(double *)pcVar7->_M_value = local_e8;
        *(double *)(pcVar7->_M_value + 8) = dStack_e0;
        if (local_c0 != local_b8) {
          local_f8 = local_e8;
          dStack_f0 = dStack_e0;
          dVar9 = dStack_e0;
          dVar1 = fabs(local_e8);
          local_c8 = dVar1 + local_c8;
        }
        in_XMM1_Qa = dVar9;
      }
      pcVar7 = TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                          local_a8 + local_c0 + local_c0 * local_98);
      local_108 = *(double *)pcVar7->_M_value;
      uStack_100 = *(undefined8 *)(pcVar7->_M_value + 8);
      in_XMM1_Qa = fabs(local_108);
      if (in_XMM1_Qa < local_c8) {
        in_XMM1_Qa = 0.0;
        std::complex<double>::complex(&local_118,local_c8 + 1.0,0.0);
        pcVar7 = TPZVec<std::complex<double>_>::operator[]
                           ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                            local_a8 + local_c0 + local_c0 * local_98);
        *(undefined8 *)pcVar7->_M_value = local_118._M_value._0_8_;
        *(undefined8 *)(pcVar7->_M_value + 8) = local_118._M_value._8_8_;
      }
    }
    local_a0 = local_98 + local_a0;
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x11f974a);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}